

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::ChannelsMerge(ImDrawList *this)

{
  int iVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  int sz_1;
  int sz;
  ImDrawChannel *ch_1;
  ImDrawCmd *pIStack_30;
  int i_1;
  ImDrawCmd *cmd_write;
  ImDrawChannel *ch;
  int local_18;
  int i;
  int new_idx_buffer_count;
  int new_cmd_buffer_count;
  ImDrawList *this_local;
  
  if (1 < this->_ChannelsCount) {
    ChannelsSetCurrent(this,0);
    if (((this->CmdBuffer).Size != 0) &&
       (pvVar2 = ImVector<ImDrawCmd>::back(&this->CmdBuffer), pvVar2->ElemCount == 0)) {
      ImVector<ImDrawCmd>::pop_back(&this->CmdBuffer);
    }
    i = 0;
    local_18 = 0;
    for (ch._4_4_ = 1; ch._4_4_ < this->_ChannelsCount; ch._4_4_ = ch._4_4_ + 1) {
      pvVar3 = ImVector<ImDrawChannel>::operator[](&this->_Channels,ch._4_4_);
      if (((pvVar3->CmdBuffer).Size != 0) &&
         (pvVar2 = ImVector<ImDrawCmd>::back(&pvVar3->CmdBuffer), pvVar2->ElemCount == 0)) {
        ImVector<ImDrawCmd>::pop_back(&pvVar3->CmdBuffer);
      }
      i = (pvVar3->CmdBuffer).Size + i;
      local_18 = (pvVar3->IdxBuffer).Size + local_18;
    }
    ImVector<ImDrawCmd>::resize(&this->CmdBuffer,(this->CmdBuffer).Size + i);
    ImVector<unsigned_short>::resize(&this->IdxBuffer,(this->IdxBuffer).Size + local_18);
    pIStack_30 = (this->CmdBuffer).Data + ((long)(this->CmdBuffer).Size - (long)i);
    this->_IdxWritePtr = (this->IdxBuffer).Data + ((long)(this->IdxBuffer).Size - (long)local_18);
    for (ch_1._4_4_ = 1; ch_1._4_4_ < this->_ChannelsCount; ch_1._4_4_ = ch_1._4_4_ + 1) {
      pvVar3 = ImVector<ImDrawChannel>::operator[](&this->_Channels,ch_1._4_4_);
      iVar1 = (pvVar3->CmdBuffer).Size;
      if (iVar1 != 0) {
        memcpy(pIStack_30,(pvVar3->CmdBuffer).Data,(long)iVar1 * 0x30);
        pIStack_30 = pIStack_30 + iVar1;
      }
      iVar1 = (pvVar3->IdxBuffer).Size;
      if (iVar1 != 0) {
        memcpy(this->_IdxWritePtr,(pvVar3->IdxBuffer).Data,(long)iVar1 << 1);
        this->_IdxWritePtr = this->_IdxWritePtr + iVar1;
      }
    }
    AddDrawCmd(this);
    this->_ChannelsCount = 1;
  }
  return;
}

Assistant:

void ImDrawList::ChannelsMerge()
{
    // Note that we never use or rely on channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_ChannelsCount <= 1)
        return;

    ChannelsSetCurrent(0);
    if (CmdBuffer.Size && CmdBuffer.back().ElemCount == 0)
        CmdBuffer.pop_back();

    int new_cmd_buffer_count = 0, new_idx_buffer_count = 0;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (ch.CmdBuffer.Size && ch.CmdBuffer.back().ElemCount == 0)
            ch.CmdBuffer.pop_back();
        new_cmd_buffer_count += ch.CmdBuffer.Size;
        new_idx_buffer_count += ch.IdxBuffer.Size;
    }
    CmdBuffer.resize(CmdBuffer.Size + new_cmd_buffer_count);
    IdxBuffer.resize(IdxBuffer.Size + new_idx_buffer_count);

    ImDrawCmd* cmd_write = CmdBuffer.Data + CmdBuffer.Size - new_cmd_buffer_count;
    _IdxWritePtr = IdxBuffer.Data + IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch.CmdBuffer.Size) { memcpy(cmd_write, ch.CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch.IdxBuffer.Size) { memcpy(_IdxWritePtr, ch.IdxBuffer.Data, sz * sizeof(ImDrawIdx)); _IdxWritePtr += sz; }
    }
    AddDrawCmd();
    _ChannelsCount = 1;
}